

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLCheck.cpp
# Opt level: O2

void sf::priv::glCheckError(char *file,uint line,char *expression)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000034;
  string error;
  string description;
  allocator<char> local_68 [32];
  string fileString;
  
  iVar1 = glGetError(file,CONCAT44(in_register_00000034,line));
  if (iVar1 == 0) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileString,file,(allocator<char> *)&error);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"Unknown error",(allocator<char> *)&description);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&description,"No description",local_68);
  switch(iVar1) {
  case 0x500:
    std::__cxx11::string::assign((char *)&error);
    break;
  case 0x501:
    std::__cxx11::string::assign((char *)&error);
    break;
  case 0x502:
    std::__cxx11::string::assign((char *)&error);
    break;
  case 0x503:
    std::__cxx11::string::assign((char *)&error);
    break;
  case 0x504:
    std::__cxx11::string::assign((char *)&error);
    break;
  case 0x505:
    std::__cxx11::string::assign((char *)&error);
    break;
  case 0x506:
    std::__cxx11::string::assign((char *)&error);
    break;
  default:
    goto switchD_0013bb54_default;
  }
  std::__cxx11::string::assign((char *)&description);
switchD_0013bb54_default:
  poVar2 = err();
  poVar2 = std::operator<<(poVar2,"An internal OpenGL call failed in ");
  std::__cxx11::string::find_last_of((char *)&fileString,0x1c1da5);
  std::__cxx11::string::substr((ulong)local_68,(ulong)&fileString);
  poVar2 = std::operator<<(poVar2,(string *)local_68);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,").");
  poVar2 = std::operator<<(poVar2,"\nExpression:\n   ");
  poVar2 = std::operator<<(poVar2,expression);
  poVar2 = std::operator<<(poVar2,"\nError description:\n   ");
  poVar2 = std::operator<<(poVar2,(string *)&error);
  poVar2 = std::operator<<(poVar2,"\n   ");
  poVar2 = std::operator<<(poVar2,(string *)&description);
  poVar2 = std::operator<<(poVar2,"\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&description);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&fileString);
  return;
}

Assistant:

void glCheckError(const char* file, unsigned int line, const char* expression)
{
    // Get the last error
    GLenum errorCode = glGetError();

    if (errorCode != GL_NO_ERROR)
    {
        std::string fileString = file;
        std::string error = "Unknown error";
        std::string description  = "No description";

        // Decode the error code
        switch (errorCode)
        {
            case GL_INVALID_ENUM:
            {
                error = "GL_INVALID_ENUM";
                description = "An unacceptable value has been specified for an enumerated argument.";
                break;
            }

            case GL_INVALID_VALUE:
            {
                error = "GL_INVALID_VALUE";
                description = "A numeric argument is out of range.";
                break;
            }

            case GL_INVALID_OPERATION:
            {
                error = "GL_INVALID_OPERATION";
                description = "The specified operation is not allowed in the current state.";
                break;
            }

            case GL_STACK_OVERFLOW:
            {
                error = "GL_STACK_OVERFLOW";
                description = "This command would cause a stack overflow.";
                break;
            }

            case GL_STACK_UNDERFLOW:
            {
                error = "GL_STACK_UNDERFLOW";
                description = "This command would cause a stack underflow.";
                break;
            }

            case GL_OUT_OF_MEMORY:
            {
                error = "GL_OUT_OF_MEMORY";
                description = "There is not enough memory left to execute the command.";
                break;
            }

            case GLEXT_GL_INVALID_FRAMEBUFFER_OPERATION:
            {
                error = "GL_INVALID_FRAMEBUFFER_OPERATION";
                description = "The object bound to FRAMEBUFFER_BINDING is not \"framebuffer complete\".";
                break;
            }
        }

        // Log the error
        err() << "An internal OpenGL call failed in "
              << fileString.substr(fileString.find_last_of("\\/") + 1) << "(" << line << ")."
              << "\nExpression:\n   " << expression
              << "\nError description:\n   " << error << "\n   " << description << "\n"
              << std::endl;
    }
}